

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O1

int64_t docio_read_doc_key_meta
                  (docio_handle *handle,uint64_t offset,docio_object *doc,bool read_on_cache_miss)

{
  err_log_callback *log_callback;
  uint uVar1;
  bool bVar2;
  docio_length dVar3;
  byte bVar4;
  ushort uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  void *pvVar8;
  fdb_status status;
  ulong uVar9;
  ulong __size;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  filemgr *pfVar13;
  char *format;
  char *pcVar14;
  bool key_alloc;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  uint8_t local_84;
  docio_length _length;
  timestamp_t _timestamp;
  fdb_seqnum_t _seqnum;
  uint32_t local_50;
  uint8_t uStack_4c;
  uint8_t uStack_4b;
  uint16_t uStack_4a;
  docio_length zero_length;
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  zero_length.keylen = 0;
  zero_length.metalen = 0;
  zero_length.bodylen = 0;
  zero_length.bodylen_ondisk = 0;
  zero_length.flag = '\0';
  zero_length.checksum = '\0';
  zero_length.reserved = 0;
  log_callback = handle->log_callback;
  uVar7 = _docio_read_length(handle,offset,&_length,log_callback,read_on_cache_miss);
  dVar3 = _length;
  if ((long)uVar7 < 0) {
    if (!read_on_cache_miss) {
      return uVar7;
    }
    fdb_log_impl(log_callback,2,(fdb_status)uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",0x465,
                 "Error in reading the doc length metadata with offset %lu from a database file \'%s\'"
                 ,offset,handle->file->filename);
    return uVar7;
  }
  zero_length.keylen = 0;
  zero_length.metalen = 0;
  zero_length.bodylen = 0;
  zero_length.bodylen_ondisk = 0;
  zero_length.flag = '\0';
  zero_length.checksum = '\0';
  zero_length.reserved = 0;
  bVar4 = _length.bodylen._3_1_;
  auVar15[0] = -((char)_length.keylen == '\0');
  auVar15[1] = -(_length.keylen._1_1_ == '\0');
  auVar15[2] = -((char)_length.metalen == '\0');
  auVar15[3] = -(_length.metalen._1_1_ == '\0');
  auVar15[4] = -((char)_length.bodylen == '\0');
  auVar15[5] = -(_length.bodylen._1_1_ == '\0');
  auVar15[6] = -(_length.bodylen._2_1_ == '\0');
  auVar15[7] = -(_length.bodylen._3_1_ == 0);
  auVar15[8] = -((char)_length.bodylen_ondisk == '\0');
  auVar15[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
  auVar15[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
  auVar15[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
  auVar15[0xc] = -(_length.flag == '\0');
  auVar15[0xd] = -(_length.checksum == '\0');
  auVar15[0xe] = -((char)_length.reserved == '\0');
  auVar15[0xf] = -(_length.reserved._1_1_ == '\0');
  if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf)
      == 0xffff) {
    (doc->length).keylen = 0;
    (doc->length).metalen = 0;
    (doc->length).bodylen = 0;
    (doc->length).bodylen_ondisk = 0;
    (doc->length).flag = '\0';
    (doc->length).checksum = '\0';
    (doc->length).reserved = 0;
    return 0;
  }
  uVar16 = _length._8_8_;
  _seqnum._0_2_ = _length.keylen;
  _seqnum._2_2_ = _length.metalen;
  _seqnum._4_4_ = _length.bodylen;
  local_50 = _length.bodylen_ondisk;
  uStack_4c = _length.flag;
  uStack_4b = _length.checksum;
  uStack_4a = _length.reserved;
  _length = dVar3;
  uVar6 = get_checksum((uint8_t *)&_seqnum,0xc,handle->file->crc_mode);
  if (_length.checksum != (uint8_t)uVar6) {
    fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",0x47a,
                 "doc_length meta checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                 ,handle->file->filename,(ulong)(uVar6 & 0xff),(ulong)_length.checksum,
                 (ulong)_length.keylen,(ulong)_length.metalen,(ulong)_length.bodylen,
                 (ulong)_length.bodylen_ondisk,offset);
    return -0xf;
  }
  uVar5 = dVar3.keylen << 8 | dVar3.keylen >> 8;
  uVar1 = dVar3.bodylen;
  uVar10 = dVar3.bodylen_ondisk;
  uVar11 = uVar16 & 0xffffffff00000000 |
           (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                  uVar10 << 0x18);
  __size = (ulong)uVar5;
  uVar9 = CONCAT44(uVar1 << 0x18 | (uint)bVar4 | uVar1 >> 8 & 0xff00 | (uVar1 & 0xff00) << 8,
                   (dVar3._1_4_ & 0xff00 | dVar3._3_4_ & 0xff) << 0x10) | __size;
  (doc->length).keylen = (short)uVar9;
  (doc->length).metalen = (short)(uVar9 >> 0x10);
  (doc->length).bodylen = (int)(uVar9 >> 0x20);
  (doc->length).bodylen_ondisk = (int)uVar11;
  (doc->length).flag = (char)(uVar11 >> 0x20);
  (doc->length).checksum = (char)(uVar11 >> 0x28);
  (doc->length).reserved = (short)(uVar11 >> 0x30);
  if ((ushort)(uVar5 + 0xf) < 0x10) {
    fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",0x482,
                 "Error in decoding the doc length metadata (key length: %d) from a database file \'%s\'"
                 ,__size,handle->file->filename);
    return -0x10;
  }
  key_alloc = doc->key == (void *)0x0;
  if (key_alloc) {
    pvVar8 = malloc(__size);
    doc->key = pvVar8;
  }
  if ((doc->meta == (void *)0x0) && (uVar9 = (ulong)(doc->length).metalen, uVar9 != 0)) {
    pvVar8 = malloc(uVar9);
    doc->meta = pvVar8;
    local_84 = '\x01';
    bVar2 = false;
  }
  else {
    bVar2 = true;
    local_84 = '\0';
  }
  uVar7 = _docio_read_doc_component(handle,uVar7,(uint)uVar5,doc->key,log_callback);
  if ((long)uVar7 < 0) {
    uVar5 = (doc->length).keylen;
    pfVar13 = handle->file;
    pcVar14 = "Error in reading a key with offset %lu, length %d from a database file \'%s\'";
    sVar12 = 0x495;
LAB_00112c69:
    fdb_log_impl(log_callback,2,(fdb_status)uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",sVar12,pcVar14,offset,(ulong)uVar5,pfVar13->filename);
  }
  else {
    uVar7 = _docio_read_doc_component(handle,uVar7,4,&_timestamp,log_callback);
    if ((long)uVar7 < 0) {
      format = "Error in reading a timestamp with offset %lu, length %d from a database file \'%s\'"
      ;
      sVar12 = 0x4a2;
      status = (fdb_status)uVar7;
      pcVar14 = handle->file->filename;
      uVar16 = 4;
    }
    else {
      doc->timestamp =
           _timestamp >> 0x18 | (_timestamp & 0xff0000) >> 8 | (_timestamp & 0xff00) << 8 |
           _timestamp << 0x18;
      uVar7 = _docio_read_doc_component(handle,uVar7,8,&_seqnum,log_callback);
      if (-1 < (long)uVar7) {
        (doc->field_3).seqnum =
             _seqnum >> 0x38 | (_seqnum & 0xff000000000000) >> 0x28 |
             (_seqnum & 0xff0000000000) >> 0x18 | (_seqnum & 0xff00000000) >> 8 |
             (_seqnum & 0xff000000) << 8 | (_seqnum & 0xff0000) << 0x18 | (_seqnum & 0xff00) << 0x28
             | _seqnum << 0x38;
        uVar7 = _docio_read_doc_component
                          (handle,uVar7,(uint)(doc->length).metalen,doc->meta,log_callback);
        if (-1 < (long)uVar7) {
          if (bVar2) {
            return uVar7;
          }
          if ((doc->length).metalen != 0) {
            return uVar7;
          }
          free(doc->meta);
          doc->meta = (void *)0x0;
          return uVar7;
        }
        uVar5 = (doc->length).metalen;
        pfVar13 = handle->file;
        pcVar14 = 
        "Error in reading the doc metadata with offset %lu, length %d from a database file \'%s\'";
        sVar12 = 0x4bb;
        goto LAB_00112c69;
      }
      format = 
      "Error in reading a sequence number with offset %lu, length %d from a database file \'%s\'";
      sVar12 = 0x4af;
      status = (fdb_status)uVar7;
      pcVar14 = handle->file->filename;
      uVar16 = 8;
    }
    fdb_log_impl(log_callback,2,status,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",sVar12,format,offset,uVar16,pcVar14);
  }
  free_docio_object(doc,key_alloc,local_84,'\0');
  return uVar7;
}

Assistant:

int64_t docio_read_doc_key_meta(struct docio_handle *handle, uint64_t offset,
                                struct docio_object *doc,
                                bool read_on_cache_miss)
{
    uint8_t checksum;
    int64_t _offset;
    int key_alloc = 0;
    int meta_alloc = 0;
    fdb_seqnum_t _seqnum;
    timestamp_t _timestamp;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback,
                                 read_on_cache_miss);
    if (_offset < 0) {
        if (read_on_cache_miss) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading the doc length metadata with offset %" _F64 " from "
                    "a database file '%s'",
                    offset, handle->file->filename);
        }
        return _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        doc->length = zero_length;
        return (int64_t) FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length meta checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }

    doc->length = _docio_length_decode(_length);
    if (doc->length.keylen == 0 || doc->length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata (key length: %d) from "
                "a database file '%s'", doc->length.keylen, handle->file->filename);
        return (int64_t) FDB_RESULT_FILE_CORRUPTION;
    }

    if (doc->key == NULL) {
        doc->key = (void *)malloc(doc->length.keylen);
        key_alloc = 1;
    }
    if (doc->meta == NULL && doc->length.metalen) {
        doc->meta = (void *)malloc(doc->length.metalen);
        meta_alloc = 1;
    }

    _offset = _docio_read_doc_component(handle, _offset, doc->length.keylen,
                                        doc->key, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.keylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    // read timestamp
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(timestamp_t),
                                        &_timestamp, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a timestamp with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(timestamp_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->timestamp = _endian_decode(_timestamp);

    // copy sequence number (optional)
    _offset = _docio_read_doc_component(handle, _offset, sizeof(fdb_seqnum_t),
                                        (void *)&_seqnum, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a sequence number with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(fdb_seqnum_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->seqnum = _endian_decode(_seqnum);

    _offset = _docio_read_doc_component(handle, _offset, doc->length.metalen,
                                        doc->meta, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc metadata with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.metalen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    uint8_t free_meta = meta_alloc && !doc->length.metalen;
    free_docio_object(doc, 0, free_meta, 0);

    return _offset;
}